

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreePrevious(BtCursor *pCur,int *pRes)

{
  short sVar1;
  uint uVar2;
  MemPage *pMVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar4 = 0;
  if (1 < pCur->eState) {
    iVar4 = btreeRestoreCursorPosition(pCur);
  }
  if (iVar4 != 0) {
    return iVar4;
  }
  pCur->atLast = '\0';
  iVar4 = 1;
  if (pCur->eState == '\0') {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    iVar6 = pCur->skipNext;
    pCur->skipNext = 0;
    if (-1 < iVar6) {
      pMVar3 = pCur->apPage[pCur->iPage];
      if (pMVar3->leaf == '\0') {
        uVar2 = *(uint *)(pMVar3->aData +
                         (CONCAT11(pMVar3->aCellIdx[(ulong)pCur->aiIdx[pCur->iPage] * 2],
                                   pMVar3->aCellIdx[(ulong)pCur->aiIdx[pCur->iPage] * 2 + 1]) &
                         pMVar3->maskPage));
        iVar6 = moveToChild(pCur,uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                                 uVar2 << 0x18);
        iVar5 = iVar6;
        if (iVar6 == 0) {
          iVar5 = moveToRightmost(pCur);
        }
        iVar4 = 0;
        if (iVar6 != 0) {
          return iVar6;
        }
        goto LAB_0016c2fc;
      }
      while( true ) {
        sVar1 = pCur->iPage;
        if (pCur->aiIdx[sVar1] != 0) break;
        if (sVar1 == 0) {
          pCur->eState = '\0';
          goto LAB_0016c2fc;
        }
        moveToParent(pCur);
      }
      (pCur->info).nSize = 0;
      pCur->validNKey = '\0';
      pCur->aiIdx[sVar1] = pCur->aiIdx[sVar1] - 1;
      iVar5 = 0;
      if ((pCur->apPage[pCur->iPage]->intKey != '\0') && (pCur->apPage[pCur->iPage]->leaf == '\0'))
      {
        iVar5 = sqlite3BtreePrevious(pCur,pRes);
      }
    }
    iVar4 = 0;
  }
LAB_0016c2fc:
  *pRes = iVar4;
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreePrevious(BtCursor *pCur, int *pRes){
  int rc;
  MemPage *pPage;

  assert( cursorHoldsMutex(pCur) );
  rc = restoreCursorPosition(pCur);
  if( rc!=SQLITE_OK ){
    return rc;
  }
  pCur->atLast = 0;
  if( CURSOR_INVALID==pCur->eState ){
    *pRes = 1;
    return SQLITE_OK;
  }
  if( pCur->skipNext<0 ){
    pCur->skipNext = 0;
    *pRes = 0;
    return SQLITE_OK;
  }
  pCur->skipNext = 0;

  pPage = pCur->apPage[pCur->iPage];
  assert( pPage->isInit );
  if( !pPage->leaf ){
    int idx = pCur->aiIdx[pCur->iPage];
    rc = moveToChild(pCur, get4byte(findCell(pPage, idx)));
    if( rc ){
      return rc;
    }
    rc = moveToRightmost(pCur);
  }else{
    while( pCur->aiIdx[pCur->iPage]==0 ){
      if( pCur->iPage==0 ){
        pCur->eState = CURSOR_INVALID;
        *pRes = 1;
        return SQLITE_OK;
      }
      moveToParent(pCur);
    }
    pCur->info.nSize = 0;
    pCur->validNKey = 0;

    pCur->aiIdx[pCur->iPage]--;
    pPage = pCur->apPage[pCur->iPage];
    if( pPage->intKey && !pPage->leaf ){
      rc = sqlite3BtreePrevious(pCur, pRes);
    }else{
      rc = SQLITE_OK;
    }
  }
  *pRes = 0;
  return rc;
}